

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  void *in_RDI;
  
  ~WildcardPattern((WildcardPattern *)0x1650e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~WildcardPattern() = default;